

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool HasDefaultConstructor(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  FunctionValue *__s;
  FunctionData *pFVar1;
  TypeBase *pTVar2;
  ArrayView<ArgumentData> arguments_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  Allocator *pAVar8;
  ulong uVar9;
  bool bVar10;
  ArrayView<FunctionValue> functions_00;
  FunctionValue bestOverload;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<FunctionValue,_32U> overloads;
  SmallArray<ArgumentData,_32U> arguments;
  uint uStack_b3c;
  FunctionValue local_b28;
  SmallArray<unsigned_int,_32U> local_b10;
  SmallArray<FunctionData_*,_32U> local_a78;
  SmallArray<FunctionValue,_32U> local_960;
  SmallArray<ArgumentData,_32U> local_648;
  ExprBase *pEVar5;
  
  for (; type != (TypeBase *)0x0; type = (TypeBase *)type[1]._vptr_TypeBase) {
    if (type->typeID != 0x13) goto LAB_001f230c;
  }
  type = (TypeBase *)0x0;
LAB_001f230c:
  local_a78.allocator = ctx->allocator;
  local_a78.data = local_a78.little;
  local_a78.count = 0;
  local_a78.max = 0x20;
  bVar3 = GetTypeConstructorFunctions(ctx,type,true,&local_a78);
  bVar10 = false;
  iVar4 = 0;
  if (bVar3) {
    pAVar8 = ctx->allocator;
    __s = local_960.little;
    memset(__s,0,0x300);
    local_960.count = 0;
    local_960.max = 0x20;
    local_960.data = __s;
    local_960.allocator = pAVar8;
    if (local_a78.count != 0) {
      uVar9 = 0;
      do {
        pFVar1 = local_a78.data[uVar9];
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
        pTVar2 = pFVar1->contextType;
        pEVar5->typeID = 9;
        pEVar5->source = source;
        pEVar5->type = pTVar2;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
        if (local_960.count == local_960.max) {
          SmallArray<FunctionValue,_32U>::grow(&local_960,local_960.count);
        }
        if (local_960.data == (FunctionValue *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
                       );
        }
        uVar7 = local_960._8_8_ & 0xffffffff;
        iVar4 = local_960.count + 1;
        local_960.count = iVar4;
        local_960.data[uVar7].source = source;
        local_960.data[uVar7].function = pFVar1;
        local_960.data[uVar7].context = pEVar5;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (local_a78._8_8_ & 0xffffffff));
      pAVar8 = ctx->allocator;
    }
    local_b10.data = local_b10.little;
    local_b10.count = 0;
    local_b10.max = 0x20;
    lVar6 = 0x20;
    do {
      *(undefined8 *)((long)local_648.little + lVar6 + -0x20) = 0;
      *(undefined1 *)((long)local_648.little + lVar6 + -0x18) = 0;
      *(undefined8 *)((long)local_648.little + lVar6 + -0x10) = 0;
      *(undefined8 *)((long)local_648.little + lVar6 + -8) = 0;
      *(undefined8 *)((long)&local_648.little[0].source + lVar6) = 0;
      *(undefined8 *)(&local_648.little[0].isExplicit + lVar6) = 0;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0x620);
    local_648.data = local_648.little;
    local_648.count = 0;
    local_648.max = 0x20;
    arguments_00._8_8_ = (ulong)uStack_b3c << 0x20;
    arguments_00.data = local_648.data;
    functions_00.count = iVar4;
    functions_00.data = local_960.data;
    functions_00._12_4_ = 0;
    local_b10.allocator = pAVar8;
    local_648.allocator = pAVar8;
    SelectBestFunction(&local_b28,ctx,source,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                       arguments_00,&local_b10);
    bVar10 = local_b28.function != (FunctionData *)0x0;
    SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
    SmallArray<unsigned_int,_32U>::~SmallArray(&local_b10);
    SmallArray<FunctionValue,_32U>::~SmallArray(&local_960);
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray(&local_a78);
  return bVar10;
}

Assistant:

bool HasDefaultConstructor(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	// Find array element type
	while(TypeArray *arrType = getType<TypeArray>(type))
		type = arrType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, true, functions))
	{
		SmallArray<FunctionValue, 32> overloads(ctx.allocator);

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			overloads.push_back(FunctionValue(source, curr, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, curr->contextType)));
		}

		SmallArray<unsigned, 32> ratings(ctx.allocator);
		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		if(FunctionValue bestOverload = SelectBestFunction(ctx, source, overloads, IntrusiveList<TypeHandle>(), arguments, ratings))
			return true;

		return false;
	}

	return false;
}